

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

ON_MeshCurvatureStats * __thiscall
ON_MeshCurvatureStats::operator=(ON_MeshCurvatureStats *this,ON_MeshCurvatureStats *src)

{
  double dVar1;
  
  if (this != src) {
    this->m_style = src->m_style;
    this->m_infinity = src->m_infinity;
    this->m_count_infinite = src->m_count_infinite;
    this->m_count = src->m_count;
    this->m_mode = src->m_mode;
    this->m_average = src->m_average;
    this->m_adev = src->m_adev;
    dVar1 = (src->m_range).m_t[1];
    (this->m_range).m_t[0] = (src->m_range).m_t[0];
    (this->m_range).m_t[1] = dVar1;
  }
  return this;
}

Assistant:

ON_MeshCurvatureStats& ON_MeshCurvatureStats::operator=(const ON_MeshCurvatureStats& src)
{
  if ( this != &src ) {
    m_style          = src.m_style;
    m_infinity       = src.m_infinity;
    m_count_infinite = src.m_count_infinite;
    m_count          = src.m_count;
    m_mode           = src.m_mode;
    m_average        = src.m_average;
    m_adev           = src.m_adev;
    m_range          = src.m_range;
  }
  return *this;
}